

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O1

Member * __thiscall soul::Structure::getMemberWithName(Structure *this,string_view memberName)

{
  size_t sVar1;
  
  sVar1 = getMemberIndex(this,memberName);
  if (sVar1 < (this->members).numActive) {
    return (this->members).items + sVar1;
  }
  throwInternalCompilerError("index < numActive","operator[]",0x9e);
}

Assistant:

Structure::Member& Structure::getMemberWithName (std::string_view memberName)
{
    return members[getMemberIndex (memberName)];
}